

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

seconds32 __thiscall libtorrent::aux::torrent::active_time(torrent *this)

{
  undefined1 auVar1 [16];
  int iVar2;
  time_point tVar3;
  
  if (((this->super_torrent_hot_members).field_0x4b & 0x18) == 0) {
    tVar3 = time_now();
    auVar1 = SEXT816((long)tVar3.__d.__r + (long)(this->m_started).__d.__r * -1000000000) *
             SEXT816(0x112e0be826d694b3);
    iVar2 = ((int)(auVar1._8_8_ >> 0x1a) - (auVar1._12_4_ >> 0x1f)) + (this->m_active_time).__r;
  }
  else {
    iVar2 = (this->m_active_time).__r;
  }
  return (seconds32)iVar2;
}

Assistant:

seconds32 torrent::active_time() const
	{
		if (is_paused())
			return m_active_time;

		// m_active_time does not account for the current "session", just the
		// time before we last started this torrent. To get the current time, we
		// need to add the time since we started it
		return m_active_time + duration_cast<seconds32>(
			aux::time_now() - m_started);
	}